

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_scan.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_e9e2::
ARTScanTest_scanFromForwardTwoLeaves_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::ARTScanTest_scanFromForwardTwoLeaves_Test
          (ARTScanTest_scanFromForwardTwoLeaves_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  ARTScanTest_scanFromForwardTwoLeaves_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  
  ARTScanTest<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
  ARTScanTest(&this->
               super_ARTScanTest<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
             );
  (this->
  super_ARTScanTest<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ).super_Test._vptr_Test = (_func_int **)&PTR__ARTScanTest_scanFromForwardTwoLeaves_Test_003ae0a0;
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTScanTest, scanFromForwardTwoLeaves) {
  unodb::test::tree_verifier<TypeParam> verifier;
  TypeParam& db = verifier.get_db();  // reference to test db instance.
  verifier.insert(0, unodb::test::test_values[0]);
  verifier.insert(1, unodb::test::test_values[1]);
  uint64_t n = 0;
  std::vector<std::pair<std::uint64_t, typename TypeParam::value_view>>
      visited{};
  auto fn = [&n,
             &visited](const unodb::visitor<typename TypeParam::iterator>& v) {
    n++;
    visited.emplace_back(decode(v.get_key()), v.get_value());
    return false;
  };
  db.scan_from(0, fn, true /*fwd*/);
  UNODB_EXPECT_EQ(2, n);
  UNODB_EXPECT_EQ(2, visited.size());
  UNODB_EXPECT_EQ(0, visited[0].first);  // verify visited in forward order.
  UNODB_EXPECT_EQ(1, visited[1].first);
}